

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::RootObjectInlineCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::RootObjectInlineCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<Js::PropertyRecord_const*,Js::RootObjectInlineCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key,RootObjectInlineCache **value)

{
  BaseDictionary<Js::PropertyRecord_const*,Js::RootObjectInlineCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  char *addr;
  hash_t hashCode;
  PropertyRecord *pPVar2;
  RootObjectInlineCache *pRVar3;
  long lVar4;
  code *pcVar5;
  long lVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  char *addr_00;
  RootObjectInlineCache *local_68;
  PropertyRecord *local_60;
  RootObjectInlineCache **local_58;
  long local_50;
  ulong local_48;
  long local_40;
  uint local_34;
  
  lVar14 = *(long *)this;
  if (lVar14 == 0) {
    BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  hashCode = (*key)->pid * 2 + 1;
  local_34 = BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar13 = *(uint *)(lVar14 + (ulong)local_34 * 4);
  if ((int)uVar13 < 0) {
    cVar7 = (char)(uVar13 >> 0x18);
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      if (*(PropertyRecord **)(*(long *)(this + 8) + 0x10 + (ulong)uVar13 * 0x18) == *key) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar12);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar8) {
          *puVar10 = 0;
          return -1;
        }
        goto LAB_00d55fdc;
      }
      uVar12 = uVar12 + 1;
      uVar13 = *(uint *)(*(long *)(this + 8) + (ulong)uVar13 * 0x18 + 8);
    } while (-1 < (int)uVar13);
    cVar7 = (char)(uVar13 >> 0x18);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar12);
  }
  iVar9 = -1;
  if (cVar7 < '\0') {
    local_58 = value;
    if (*(int *)(this + 0x28) == 0) {
      uVar13 = *(uint *)(this + 0x20);
      if (uVar13 == *(uint *)(this + 0x18)) {
        BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this);
        local_34 = BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
        uVar13 = *(uint *)(this + 0x20);
      }
      uVar11 = (ulong)uVar13;
      *(uint *)(this + 0x20) = uVar13 + 1;
      if (*(int *)(this + 0x18) < (int)(uVar13 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar8) goto LAB_00d55fdc;
        *puVar10 = 0;
      }
      if (*(int *)(this + 0x18) <= (int)uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar8) goto LAB_00d55fdc;
        *puVar10 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar8) goto LAB_00d55fdc;
        *puVar10 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar8) goto LAB_00d55fdc;
        *puVar10 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar8) {
LAB_00d55fdc:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar10 = 0;
      }
      uVar11 = (ulong)*(uint *)(this + 0x24);
      pBVar1 = this + 0x28;
      *(int *)pBVar1 = *(int *)pBVar1 + -1;
      if (*(int *)pBVar1 != 0) {
        iVar9 = BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetNextFreeEntryIndex
                          ((EntryType *)
                           ((long)(int)*(uint *)(this + 0x24) * 0x18 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar9;
      }
    }
    local_40 = *(long *)(this + 8);
    local_50 = (long)(int)uVar11;
    lVar6 = local_50 * 0x18;
    addr = (char *)(local_40 + lVar6);
    pPVar2 = *key;
    local_48 = uVar11;
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60 = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    pRVar3 = *local_58;
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68 = pRVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    pRVar3 = local_68;
    Memory::Recycler::WBSetBit(addr);
    addr_00 = (char *)((undefined8 *)(local_40 + lVar6) + 2);
    *(undefined8 *)(local_40 + lVar6) = pRVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pPVar2 = local_60;
    Memory::Recycler::WBSetBit(addr_00);
    *(PropertyRecord **)addr_00 = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    lVar14 = *(long *)this;
    lVar4 = *(long *)(this + 8);
    *(undefined4 *)(lVar4 + 8 + lVar6) = *(undefined4 *)(lVar14 + (ulong)local_34 * 4);
    *(int *)(lVar14 + (ulong)local_34 * 4) = (int)local_50;
    uVar12 = 0;
    iVar9 = (int)local_48;
    uVar11 = local_48;
    do {
      uVar13 = *(uint *)(lVar4 + 8 + (long)(int)uVar11 * 0x18);
      uVar11 = (ulong)uVar13;
      uVar12 = uVar12 + 1;
    } while (uVar13 != 0xffffffff);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar12);
    }
  }
  return iVar9;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }